

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O1

int IDAApolynomialGetY(IDAMem IDA_mem,sunrealtype t,N_Vector yy,N_Vector yp,N_Vector *yyS,
                      N_Vector *ypS)

{
  uint uVar1;
  IDAadjMemRec *pIVar2;
  IDAdtpntMemRec **ppIVar3;
  IDAdtpntMemRec *pIVar4;
  undefined8 *puVar5;
  sunrealtype *psVar6;
  double *pdVar7;
  bool bVar8;
  N_Vector *pp_Var9;
  N_Vector p_Var10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar23;
  undefined1 auVar24 [16];
  double dVar25;
  undefined1 auVar26 [16];
  int iVar27;
  int newpoint;
  long index;
  int local_e0;
  ulong local_d8;
  int local_ac;
  undefined1 local_a8 [16];
  double local_98;
  ulong uStack_90;
  N_Vector *local_80;
  sunrealtype local_78;
  N_Vector local_70;
  undefined1 local_68 [16];
  N_Vector local_50;
  N_Vector *local_48;
  ulong local_40;
  ulong local_38;
  long lVar22;
  
  pIVar2 = IDA_mem->ida_adj_mem;
  uVar13 = 0;
  if ((yyS != (N_Vector *)0x0) && (pIVar2->ia_interpSensi != 0)) {
    uVar13 = (ulong)(uint)IDA_mem->ida_Ns;
  }
  ppIVar3 = pIVar2->dt_mem;
  local_80 = ypS;
  local_78 = t;
  local_70 = yy;
  iVar11 = IDAAfindIndex(IDA_mem,t,(long *)&local_38,&local_ac);
  if (iVar11 != 0) {
    return iVar11;
  }
  local_e0 = (int)uVar13;
  if (local_38 == 0) {
    puVar5 = (undefined8 *)(*ppIVar3)->content;
    N_VScale(0x3ff0000000000000,*puVar5,local_70);
    N_VScale(0x3ff0000000000000,puVar5[2],yp);
    auVar26 = _DAT_00134070;
    if (local_e0 < 1) {
      return 0;
    }
    psVar6 = IDA_mem->ida_cvals;
    lVar14 = uVar13 - 1;
    auVar17._8_4_ = (int)lVar14;
    auVar17._0_8_ = lVar14;
    auVar17._12_4_ = (int)((ulong)lVar14 >> 0x20);
    lVar14 = 0;
    auVar17 = auVar17 ^ _DAT_00134070;
    auVar24 = _DAT_00134060;
    do {
      bVar8 = auVar17._0_4_ < SUB164(auVar24 ^ auVar26,0);
      iVar11 = auVar17._4_4_;
      iVar12 = SUB164(auVar24 ^ auVar26,4);
      if ((bool)(~(iVar11 < iVar12 || iVar12 == iVar11 && bVar8) & 1)) {
        *(undefined8 *)((long)psVar6 + lVar14) = 0x3ff0000000000000;
      }
      if (iVar11 >= iVar12 && (iVar12 != iVar11 || !bVar8)) {
        *(undefined8 *)((long)psVar6 + lVar14 + 8) = 0x3ff0000000000000;
      }
      lVar22 = auVar24._8_8_;
      auVar24._0_8_ = auVar24._0_8_ + 2;
      auVar24._8_8_ = lVar22 + 2;
      lVar14 = lVar14 + 0x10;
    } while ((ulong)(local_e0 + 1U >> 1) << 4 != lVar14);
    iVar11 = N_VScaleVectorArray(uVar13,IDA_mem->ida_cvals,puVar5[1],yyS);
    if (iVar11 != 0) {
      return -0x1c;
    }
    iVar11 = N_VScaleVectorArray(uVar13,IDA_mem->ida_cvals,puVar5[3],local_80);
  }
  else {
    auVar26._0_8_ = ABS(ppIVar3[local_38]->t - ppIVar3[local_38 - 1]->t);
    auVar26._8_8_ = 0;
    if (pIVar2->ia_tfinal <= pIVar2->ia_tinitial) {
      uVar1 = *(uint *)((long)ppIVar3[local_38 - 1]->content + 0x20);
      local_d8 = (ulong)uVar1;
      if ((long)(int)uVar1 < (long)(pIVar2->ia_np - local_38)) {
        uVar16 = pIVar2->ia_np + ~(long)(int)uVar1;
      }
      else {
        uVar16 = local_38 - 1;
      }
    }
    else {
      local_d8 = (ulong)*(int *)((long)ppIVar3[local_38]->content + 0x20);
      uVar16 = local_d8;
      if ((long)local_d8 < (long)local_38) {
        uVar16 = local_38;
      }
    }
    iVar11 = (int)local_d8;
    local_68 = auVar26;
    local_50 = yp;
    local_48 = yyS;
    if (local_ac != 0) {
      if (pIVar2->ia_tfinal <= pIVar2->ia_tinitial) {
        if (-1 < iVar11) {
          local_98 = (double)(ulong)(iVar11 + 1);
          lVar14 = uVar13 - 1;
          auVar20._8_4_ = (int)lVar14;
          auVar20._0_8_ = lVar14;
          auVar20._12_4_ = (int)((ulong)lVar14 >> 0x20);
          auVar26._0_8_ = 0.0;
          local_a8 = auVar20 ^ _DAT_00134070;
          do {
            pIVar4 = ppIVar3[uVar16 + ((long)auVar26._0_8_ - 1U)];
            pIVar2->ia_T[(long)auVar26._0_8_] = pIVar4->t;
            puVar5 = (undefined8 *)pIVar4->content;
            N_VScale(0x3ff0000000000000,*puVar5,pIVar2->ia_Y[(long)auVar26._0_8_]);
            auVar24 = _DAT_00134070;
            if (0 < local_e0) {
              psVar6 = IDA_mem->ida_cvals;
              lVar14 = 0;
              auVar21 = _DAT_00134060;
              do {
                bVar8 = local_a8._0_4_ < SUB164(auVar21 ^ auVar24,0);
                iVar12 = SUB164(auVar21 ^ auVar24,4);
                iVar27 = local_a8._4_4_;
                if ((bool)(~(iVar27 < iVar12 || iVar12 == iVar27 && bVar8) & 1)) {
                  *(undefined8 *)((long)psVar6 + lVar14) = 0x3ff0000000000000;
                }
                if (iVar27 >= iVar12 && (iVar12 != iVar27 || !bVar8)) {
                  *(undefined8 *)((long)psVar6 + lVar14 + 8) = 0x3ff0000000000000;
                }
                lVar22 = auVar21._8_8_;
                auVar21._0_8_ = auVar21._0_8_ + 2;
                auVar21._8_8_ = lVar22 + 2;
                lVar14 = lVar14 + 0x10;
              } while ((ulong)(local_e0 + 1U >> 1) << 4 != lVar14);
              iVar12 = N_VScaleVectorArray(uVar13,IDA_mem->ida_cvals,puVar5[1]);
              if (iVar12 != 0) {
                return -0x1c;
              }
            }
            auVar26._0_8_ = (double)((long)auVar26._0_8_ + 1);
          } while (auVar26._0_8_ != local_98);
        }
      }
      else if (-1 < iVar11) {
        local_98 = (double)(ulong)(iVar11 + 1);
        lVar14 = uVar13 - 1;
        auVar18._8_4_ = (int)lVar14;
        auVar18._0_8_ = lVar14;
        auVar18._12_4_ = (int)((ulong)lVar14 >> 0x20);
        auVar26._0_8_ = 0.0;
        local_a8 = auVar18 ^ _DAT_00134070;
        do {
          pIVar4 = ppIVar3[uVar16 - (long)auVar26._0_8_];
          pIVar2->ia_T[(long)auVar26._0_8_] = pIVar4->t;
          puVar5 = (undefined8 *)pIVar4->content;
          N_VScale(0x3ff0000000000000,*puVar5,pIVar2->ia_Y[(long)auVar26._0_8_]);
          auVar24 = _DAT_00134070;
          if (0 < local_e0) {
            psVar6 = IDA_mem->ida_cvals;
            lVar14 = 0;
            auVar19 = _DAT_00134060;
            do {
              bVar8 = local_a8._0_4_ < SUB164(auVar19 ^ auVar24,0);
              iVar12 = SUB164(auVar19 ^ auVar24,4);
              iVar27 = local_a8._4_4_;
              if ((bool)(~(iVar27 < iVar12 || iVar12 == iVar27 && bVar8) & 1)) {
                *(undefined8 *)((long)psVar6 + lVar14) = 0x3ff0000000000000;
              }
              if (iVar27 >= iVar12 && (iVar12 != iVar27 || !bVar8)) {
                *(undefined8 *)((long)psVar6 + lVar14 + 8) = 0x3ff0000000000000;
              }
              lVar22 = auVar19._8_8_;
              auVar19._0_8_ = auVar19._0_8_ + 2;
              auVar19._8_8_ = lVar22 + 2;
              lVar14 = lVar14 + 0x10;
            } while ((ulong)(local_e0 + 1U >> 1) << 4 != lVar14);
            iVar12 = N_VScaleVectorArray(uVar13,IDA_mem->ida_cvals,puVar5[1]);
            if (iVar12 != 0) {
              return -0x1c;
            }
          }
          auVar26._0_8_ = (double)((long)auVar26._0_8_ + 1);
        } while (auVar26._0_8_ != local_98);
      }
      auVar26._0_8_ = (double)local_68._0_8_;
      if (0 < iVar11) {
        local_a8._0_8_ = local_d8 & 0xffffffff;
        local_40 = (ulong)(iVar11 + 1);
        uVar16 = 1;
        do {
          lVar14 = local_a8._0_8_;
          auVar26._0_8_ = (double)local_68._0_8_;
          uVar15 = local_68._8_8_;
          do {
            auVar26._0_8_ =
                 auVar26._0_8_ /
                 (pIVar2->ia_T[lVar14] - *(double *)((long)pIVar2 + (lVar14 - uVar16) * 8 + 0x128));
            local_98 = -auVar26._0_8_;
            uStack_90 = uVar15 ^ 0x8000000000000000;
            N_VLinearSum(auVar26._0_8_,pIVar2->ia_Y[lVar14],pIVar2->ia_Y[lVar14 + -1],
                         pIVar2->ia_Y[lVar14]);
            if (0 < local_e0) {
              uVar15 = 0;
              do {
                N_VLinearSum(auVar26._0_8_,local_98,pIVar2->ia_YS[lVar14][uVar15],
                             (&pIVar2->ia_Y[lVar14 + 5]->content)[uVar15],
                             pIVar2->ia_YS[lVar14][uVar15]);
                uVar15 = uVar15 + 1;
              } while (uVar13 != uVar15);
            }
            bVar8 = (long)uVar16 < lVar14;
            lVar14 = lVar14 + -1;
            auVar26._0_8_ = (double)local_68._0_8_;
            uVar15 = local_68._8_8_;
          } while (bVar8);
          uVar16 = uVar16 + 1;
        } while (uVar16 != local_40);
      }
    }
    pdVar7 = IDA_mem->ida_cvals;
    *pdVar7 = 1.0;
    if (0 < iVar11) {
      dVar23 = *pdVar7;
      uVar16 = 0;
      do {
        dVar23 = ((local_78 - pIVar2->ia_T[uVar16]) * dVar23) / auVar26._0_8_;
        pdVar7[uVar16 + 1] = dVar23;
        uVar16 = uVar16 + 1;
      } while ((local_d8 & 0xffffffff) != uVar16);
    }
    iVar12 = N_VLinearCombination(iVar11 + 1,pdVar7,pIVar2->ia_Y,local_70);
    p_Var10 = local_50;
    pp_Var9 = local_80;
    if (iVar12 != 0) {
      return -0x1c;
    }
    if ((0 < local_e0) &&
       (iVar12 = N_VLinearCombinationVectorArray
                           (uVar13,iVar11 + 1,IDA_mem->ida_cvals,pIVar2->ia_YS,local_48),
       iVar12 != 0)) {
      return -0x1c;
    }
    if (0 < iVar11) {
      psVar6 = IDA_mem->ida_cvals;
      auVar26._0_8_ = 1.0;
      dVar23 = 0.0;
      uVar16 = 0;
      do {
        dVar25 = (local_78 - pIVar2->ia_T[uVar16]) / (double)local_68._0_8_;
        dVar23 = dVar23 * dVar25 + auVar26._0_8_ / (double)local_68._0_8_;
        auVar26._0_8_ = auVar26._0_8_ * dVar25;
        psVar6[uVar16] = dVar23;
        uVar16 = uVar16 + 1;
      } while ((local_d8 & 0xffffffff) != uVar16);
    }
    iVar11 = N_VLinearCombination(local_d8 & 0xffffffff,IDA_mem->ida_cvals,pIVar2->ia_Y + 1,p_Var10)
    ;
    if (iVar11 != 0) {
      return -0x1c;
    }
    if (local_e0 < 1) {
      return 0;
    }
    iVar11 = N_VLinearCombinationVectorArray
                       (uVar13,local_d8 & 0xffffffff,IDA_mem->ida_cvals,pIVar2->ia_YS + 1,pp_Var9);
  }
  if (iVar11 == 0) {
    return 0;
  }
  return -0x1c;
}

Assistant:

static int IDAApolynomialGetY(IDAMem IDA_mem, sunrealtype t, N_Vector yy,
                              N_Vector yp, N_Vector* yyS, N_Vector* ypS)
{
  IDAadjMem IDAADJ_mem;
  IDAdtpntMem* dt_mem;
  IDApolynomialDataMem content;

  int flag, dir, order, i, j, is, NS, retval;
  long int index, base;
  sunbooleantype newpoint;
  sunrealtype delt, factor, Psi, Psiprime;

  IDAADJ_mem = IDA_mem->ida_adj_mem;
  dt_mem     = IDAADJ_mem->dt_mem;

  /* Local value of Ns */
  NS = (IDAADJ_mem->ia_interpSensi && (yyS != NULL)) ? IDA_mem->ida_Ns : 0;

  /* Get the index in dt_mem */
  flag = IDAAfindIndex(IDA_mem, t, &index, &newpoint);
  if (flag != IDA_SUCCESS) { return (flag); }

  /* If we are beyond the left limit but close enough,
     then return y at the left limit. */

  if (index == 0)
  {
    content = (IDApolynomialDataMem)(dt_mem[0]->content);
    N_VScale(ONE, content->y, yy);
    N_VScale(ONE, content->yd, yp);

    if (NS > 0)
    {
      for (is = 0; is < NS; is++) { IDA_mem->ida_cvals[is] = ONE; }

      retval = N_VScaleVectorArray(NS, IDA_mem->ida_cvals, content->yS, yyS);
      if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }

      retval = N_VScaleVectorArray(NS, IDA_mem->ida_cvals, content->ySd, ypS);
      if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }
    }

    return (IDA_SUCCESS);
  }

  /* Scaling factor */
  delt = SUNRabs(dt_mem[index]->t - dt_mem[index - 1]->t);

  /* Find the direction of the forward integration */
  dir = (IDAADJ_mem->ia_tfinal - IDAADJ_mem->ia_tinitial > ZERO) ? 1 : -1;

  /* Establish the base point depending on the integration direction.
     Modify the base if there are not enough points for the current order */

  if (dir == 1)
  {
    base    = index;
    content = (IDApolynomialDataMem)(dt_mem[base]->content);
    order   = content->order;
    if (index < order) { base += order - index; }
  }
  else
  {
    base    = index - 1;
    content = (IDApolynomialDataMem)(dt_mem[base]->content);
    order   = content->order;
    if (IDAADJ_mem->ia_np - index > order)
    {
      base -= index + order - IDAADJ_mem->ia_np;
    }
  }

  /* Recompute Y (divided differences for Newton polynomial) if needed */

  if (newpoint)
  {
    /* Store 0-th order DD */
    if (dir == 1)
    {
      for (j = 0; j <= order; j++)
      {
        IDAADJ_mem->ia_T[j] = dt_mem[base - j]->t;
        content             = (IDApolynomialDataMem)(dt_mem[base - j]->content);
        N_VScale(ONE, content->y, IDAADJ_mem->ia_Y[j]);

        if (NS > 0)
        {
          for (is = 0; is < NS; is++) { IDA_mem->ida_cvals[is] = ONE; }
          retval = N_VScaleVectorArray(NS, IDA_mem->ida_cvals, content->yS,
                                       IDAADJ_mem->ia_YS[j]);
          if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }
        }
      }
    }
    else
    {
      for (j = 0; j <= order; j++)
      {
        IDAADJ_mem->ia_T[j] = dt_mem[base - 1 + j]->t;
        content = (IDApolynomialDataMem)(dt_mem[base - 1 + j]->content);
        N_VScale(ONE, content->y, IDAADJ_mem->ia_Y[j]);

        if (NS > 0)
        {
          for (is = 0; is < NS; is++) { IDA_mem->ida_cvals[is] = ONE; }
          retval = N_VScaleVectorArray(NS, IDA_mem->ida_cvals, content->yS,
                                       IDAADJ_mem->ia_YS[j]);
          if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }
        }
      }
    }

    /* Compute higher-order DD */
    for (i = 1; i <= order; i++)
    {
      for (j = order; j >= i; j--)
      {
        factor = delt / (IDAADJ_mem->ia_T[j] - IDAADJ_mem->ia_T[j - i]);
        N_VLinearSum(factor, IDAADJ_mem->ia_Y[j], -factor,
                     IDAADJ_mem->ia_Y[j - 1], IDAADJ_mem->ia_Y[j]);

        for (is = 0; is < NS; is++)
        {
          N_VLinearSum(factor, IDAADJ_mem->ia_YS[j][is], -factor,
                       IDAADJ_mem->ia_YS[j - 1][is], IDAADJ_mem->ia_YS[j][is]);
        }
      }
    }
  }

  /* Perform the actual interpolation for yy using nested multiplications */

  IDA_mem->ida_cvals[0] = ONE;
  for (i = 0; i < order; i++)
  {
    IDA_mem->ida_cvals[i + 1] = IDA_mem->ida_cvals[i] *
                                (t - IDAADJ_mem->ia_T[i]) / delt;
  }

  retval = N_VLinearCombination(order + 1, IDA_mem->ida_cvals, IDAADJ_mem->ia_Y,
                                yy);
  if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }

  if (NS > 0)
  {
    retval = N_VLinearCombinationVectorArray(NS, order + 1, IDA_mem->ida_cvals,
                                             IDAADJ_mem->ia_YS, yyS);
    if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }
  }

  /* Perform the actual interpolation for yp.

     Writing p(t) = y0 + (t-t0)*f[t0,t1] + ... + (t-t0)(t-t1)...(t-tn)*f[t0,t1,...tn],
     denote psi_k(t) = (t-t0)(t-t1)...(t-tk).

     The formula used for p'(t) is:
       - p'(t) = f[t0,t1] + psi_1'(t)*f[t0,t1,t2] + ... + psi_n'(t)*f[t0,t1,...,tn]

     We recursively compute psi_k'(t) from:
       - psi_k'(t) = (t-tk)*psi_{k-1}'(t) + psi_{k-1}

     psi_k is rescaled with 1/delt each time is computed, because the Newton DDs from Y were
     scaled with delt.
  */

  Psi      = ONE;
  Psiprime = ZERO;

  for (i = 1; i <= order; i++)
  {
    factor = (t - IDAADJ_mem->ia_T[i - 1]) / delt;

    Psiprime = Psi / delt + factor * Psiprime;
    Psi      = Psi * factor;

    IDA_mem->ida_cvals[i - 1] = Psiprime;
  }

  retval = N_VLinearCombination(order, IDA_mem->ida_cvals, IDAADJ_mem->ia_Y + 1,
                                yp);
  if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }

  if (NS > 0)
  {
    retval = N_VLinearCombinationVectorArray(NS, order, IDA_mem->ida_cvals,
                                             IDAADJ_mem->ia_YS + 1, ypS);
    if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }
  }

  return (IDA_SUCCESS);
}